

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_KillChildren(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *source;
  AActor *inflictor;
  AActor *killtarget;
  AActor *pAVar6;
  PClassActor *pPVar7;
  uint uVar8;
  AActor *origin;
  VMValue *pVVar9;
  char *pcVar10;
  int selector;
  bool bVar11;
  bool bVar12;
  TThinkerIterator<AActor> it;
  int local_64;
  int local_60;
  int local_5c;
  PClassActor *local_58;
  FName local_50;
  FName local_4c;
  FThinkerIterator local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_00685af4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00685ae4;
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_0068574a;
    pPVar5 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (origin->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar11 = pPVar5 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar5 == pPVar3;
    if (!bVar12 && !bVar11) {
      do {
        pPVar5 = pPVar5->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar8 = (uint)bVar11;
    if ((char)ret == '\0') {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00685af4;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_00685ae4;
LAB_0068574a:
    origin = (AActor *)0x0;
    pVVar9 = param;
    uVar8 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
LAB_00685813:
    local_5c = 0;
LAB_00685826:
    local_58 = (PClassActor *)0x0;
    local_60 = 0;
LAB_0068582e:
    local_64 = 0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_00685ae4:
        pcVar10 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00685af4;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
            puVar2[1] = pPVar5;
          }
          bVar11 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar3 && bVar11) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar11 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar3) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar11) {
            pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_00685af4;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_00685ae4;
    }
    if (numparam < 3) goto LAB_00685813;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00685af4:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    if (numparam == 3) goto LAB_00685813;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_5c = param[3].field_0.i;
    }
    else {
      local_5c = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1968,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 5) goto LAB_00685826;
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_60 = param[4].field_0.i;
    }
    else {
      local_60 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1969,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam == 5) {
      local_58 = (PClassActor *)0x0;
      goto LAB_0068582e;
    }
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == 0xff) goto LAB_00685a07;
    if (VVar1 != '\x03') {
LAB_00685b15:
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
LAB_00685b1c:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196a,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    local_58 = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag == 1) {
      if (local_58 == (PClassActor *)0x0) goto LAB_00685a07;
      pPVar7 = local_58;
      if (local_58 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 == (PClassActor *)0x0) {
          pcVar10 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_00685b1c;
        }
      }
    }
    else {
      if (local_58 != (PClassActor *)0x0) goto LAB_00685b15;
LAB_00685a07:
      local_58 = (PClassActor *)0x0;
    }
    if (numparam < 7) goto LAB_0068582e;
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_64 = param[6].field_0.i;
    }
    else {
      local_64 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x196b,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam != 7) {
      VVar1 = param[7].field_0.field_3.Type;
      if (VVar1 == '\0') {
        iVar4 = param[7].field_0.i;
      }
      else {
        iVar4 = 0;
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x196c,
                        "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      selector = 0;
      if (8 < (uint)numparam) {
        VVar1 = param[8].field_0.field_3.Type;
        if (VVar1 == '\0') {
          selector = param[8].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x196d,
                        "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      goto LAB_00685839;
    }
  }
  iVar4 = 0;
  selector = 0;
LAB_00685839:
  source = COPY_AAPTR(origin,iVar4);
  inflictor = COPY_AAPTR(origin,selector);
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  killtarget = (AActor *)FThinkerIterator::Next(&local_48);
  if (killtarget != (AActor *)0x0) {
    do {
      pAVar6 = (killtarget->master).field_0.p;
      if (pAVar6 == (AActor *)0x0) {
LAB_006858a7:
        pAVar6 = (AActor *)0x0;
      }
      else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (killtarget->master).field_0.p = (AActor *)0x0;
        goto LAB_006858a7;
      }
      if (pAVar6 == origin) {
        local_4c.Index = local_5c;
        local_50.Index = local_64;
        DoKill(killtarget,inflictor,source,&local_4c,local_60,local_58,&local_50);
      }
      killtarget = (AActor *)FThinkerIterator::Next(&local_48);
    } while (killtarget != (AActor *)0x0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillChildren)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self) 
		{
			DoKill(mo, inflictor, source, damagetype, flags, filter, species);
		}
	}
	return 0;
}